

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_half_pass.h
# Opt level: O3

void __thiscall spvtools::opt::ConvertToHalfPass::ConvertToHalfPass(ConvertToHalfPass *this)

{
  Pass::Pass(&this->super_Pass);
  (this->super_Pass)._vptr_Pass = (_func_int **)&PTR__ConvertToHalfPass_00b0a140;
  (this->target_ops_core_)._M_h._M_buckets = &(this->target_ops_core_)._M_h._M_single_bucket;
  (this->target_ops_core_)._M_h._M_bucket_count = 1;
  (this->target_ops_core_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->target_ops_core_)._M_h._M_element_count = 0;
  (this->target_ops_core_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->target_ops_core_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->target_ops_core_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->target_ops_450_)._M_h._M_buckets = &(this->target_ops_450_)._M_h._M_single_bucket;
  (this->target_ops_450_)._M_h._M_bucket_count = 1;
  (this->target_ops_450_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->target_ops_450_)._M_h._M_element_count = 0;
  (this->target_ops_450_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->target_ops_450_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->target_ops_450_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->image_ops_)._M_h._M_buckets = &(this->image_ops_)._M_h._M_single_bucket;
  (this->image_ops_)._M_h._M_bucket_count = 1;
  (this->image_ops_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->image_ops_)._M_h._M_element_count = 0;
  (this->image_ops_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->image_ops_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->image_ops_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->dref_image_ops_)._M_h._M_buckets = &(this->dref_image_ops_)._M_h._M_single_bucket;
  (this->dref_image_ops_)._M_h._M_bucket_count = 1;
  (this->dref_image_ops_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->dref_image_ops_)._M_h._M_element_count = 0;
  (this->dref_image_ops_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->dref_image_ops_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->dref_image_ops_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->closure_ops_)._M_h._M_buckets = &(this->closure_ops_)._M_h._M_single_bucket;
  (this->closure_ops_)._M_h._M_bucket_count = 1;
  (this->closure_ops_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->closure_ops_)._M_h._M_element_count = 0;
  (this->closure_ops_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->closure_ops_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->closure_ops_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->relaxed_ids_set_)._M_h._M_buckets = &(this->relaxed_ids_set_)._M_h._M_single_bucket;
  (this->relaxed_ids_set_)._M_h._M_bucket_count = 1;
  (this->relaxed_ids_set_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->relaxed_ids_set_)._M_h._M_element_count = 0;
  (this->relaxed_ids_set_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->relaxed_ids_set_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->relaxed_ids_set_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->converted_ids_)._M_h._M_buckets = &(this->converted_ids_)._M_h._M_single_bucket;
  (this->converted_ids_)._M_h._M_bucket_count = 1;
  (this->converted_ids_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->converted_ids_)._M_h._M_element_count = 0;
  (this->converted_ids_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->converted_ids_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->converted_ids_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

ConvertToHalfPass() : Pass() {}